

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

String * __thiscall
kj::str<char_const(&)[2],kj::StringPtr&,char_const(&)[2],kj::String,char_const(&)[18]>
          (String *__return_storage_ptr__,kj *this,char (*params) [2],StringPtr *params_1,
          char (*params_2) [2],String *params_3,char (*params_4) [18])

{
  char *pcVar1;
  ArrayPtr<const_char> *params_4_00;
  ArrayPtr<const_char> AVar2;
  ArrayPtr<const_char> local_68;
  ArrayPtr<const_char> local_58;
  ArrayPtr<const_char> local_48;
  ArrayPtr<const_char> local_38;
  
  local_58 = toCharSequence<char_const(&)[2]>((char (*) [2])this);
  local_68.ptr = *(char **)params;
  local_68.size_ = *(long *)(params + 4) - 1;
  AVar2 = toCharSequence<char_const(&)[2]>((char (*) [2])params_1);
  params_4_00 = (ArrayPtr<const_char> *)AVar2.ptr;
  pcVar1 = *(char **)(params_2 + 4);
  local_38.ptr = pcVar1;
  if (pcVar1 != (char *)0x0) {
    local_38.ptr = *(char **)params_2;
  }
  local_38.size_ = (size_t)(char *)0x0;
  if (pcVar1 != (char *)0x0) {
    local_38.size_ = (size_t)(pcVar1 + -1);
  }
  local_48 = toCharSequence<char_const(&)[18]>((char (*) [18])params_3);
  _::
  concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_58,&local_68,
             (ArrayPtr<const_char> *)&stack0xffffffffffffff88,&local_38,&local_48,params_4_00);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}